

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O3

bool __thiscall spvtools::opt::LoopFissionImpl::GroupInstructionsByUseDef(LoopFissionImpl *this)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  Function *pFVar3;
  pointer puVar4;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var5;
  Loop *pLVar6;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> uVar7;
  mapped_type_conflict mVar8;
  bool bVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  BasicBlock *pBVar12;
  const_iterator cVar13;
  pointer puVar14;
  mapped_type_conflict *pmVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  ulong uVar18;
  Instruction *inst;
  Instruction *pIVar19;
  long lVar20;
  Instruction *inst_1;
  ulong uVar21;
  size_t index_1;
  ulong uVar22;
  vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  local_c8;
  _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  local_a8;
  pointer local_78;
  pointer local_70;
  _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  local_68;
  
  local_c8.
  super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar12 = Loop::FindConditionBlock(this->loop_);
  if (pBVar12 == (BasicBlock *)0x0) {
    bVar9 = false;
  }
  else {
    pIVar19 = (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar19 == (Instruction *)0x0) ||
       ((pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    pFVar3 = this->loop_->loop_header_->function_;
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl._0_8_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    TraverseUseDef(this,(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                        super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_,
                   (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&local_68,true,true);
    puVar14 = (pFVar3->blocks_).
              super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (pFVar3->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar14 != puVar4) {
      do {
        _Var5._M_head_impl =
             (puVar14->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        pLVar6 = this->loop_;
        uVar7._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             ((_Var5._M_head_impl)->label_)._M_t;
        uVar10 = 0;
        if (*(bool *)((long)uVar7._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl
                     + 0x2d) == true) {
          uVar10 = Instruction::GetSingleWordOperand
                             ((Instruction *)
                              uVar7._M_t.
                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl,
                              (uint)*(bool *)((long)uVar7._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                                  .
                                                  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                                  ._M_head_impl + 0x2c));
        }
        local_a8._M_impl._0_4_ = uVar10;
        cVar13 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&(pLVar6->loop_basic_blocks_)._M_h,(key_type_conflict *)&local_a8);
        if (cVar13.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
          for (pIVar19 = *(Instruction **)((long)&(_Var5._M_head_impl)->insts_ + 0x10);
              pIVar19 != (Instruction *)((long)&(_Var5._M_head_impl)->insts_ + 8U);
              pIVar19 = (pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
            if ((pIVar19->opcode_ == OpSelectionMerge) ||
               (bVar9 = spvOpcodeIsBranch(pIVar19->opcode_), bVar9)) {
              TraverseUseDef(this,pIVar19,
                             (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                              *)&local_68,true,true);
            }
          }
        }
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar4);
      puVar14 = (pFVar3->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_78 = (pFVar3->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar14 != local_78) {
        p_Var1 = &(this->seen_instructions_)._M_t._M_impl.super__Rb_tree_header;
        do {
          _Var5._M_head_impl =
               (puVar14->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          pLVar6 = this->loop_;
          uVar7._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
               ((_Var5._M_head_impl)->label_)._M_t;
          uVar10 = 0;
          local_70 = puVar14;
          if (*(bool *)((long)uVar7._M_t.
                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl + 0x2d) == true) {
            uVar10 = Instruction::GetSingleWordOperand
                               ((Instruction *)
                                uVar7._M_t.
                                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                _M_head_impl,
                                (uint)*(bool *)((long)uVar7._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                                  .
                                                  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                                  ._M_head_impl + 0x2c));
          }
          local_a8._M_impl._0_4_ = uVar10;
          cVar13 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(pLVar6->loop_basic_blocks_)._M_h,(key_type_conflict *)&local_a8);
          if (cVar13.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            pIVar19 = (this->loop_->loop_header_->label_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            uVar11 = 0;
            uVar10 = 0;
            if (pIVar19->has_result_id_ == true) {
              uVar10 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
            }
            uVar7._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
                 ((_Var5._M_head_impl)->label_)._M_t;
            if (*(bool *)((long)uVar7._M_t.
                                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                _M_head_impl + 0x2d) == true) {
              uVar11 = Instruction::GetSingleWordOperand
                                 ((Instruction *)
                                  uVar7._M_t.
                                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                  _M_head_impl,
                                  (uint)*(bool *)((long)uVar7._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                                  .
                                                  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                                  ._M_head_impl + 0x2c));
            }
            if (uVar10 != uVar11) {
              for (pIVar19 = *(Instruction **)((long)&(_Var5._M_head_impl)->insts_ + 0x10);
                  pIVar19 != (Instruction *)((long)&(_Var5._M_head_impl)->insts_ + 8U);
                  pIVar19 = (pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                            next_node_) {
                if (pIVar19->opcode_ - OpLoad < 2) {
                  mVar8 = (this->instruction_order_)._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count;
                  local_a8._M_impl._0_8_ = pIVar19;
                  pmVar15 = std::
                            map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                            ::operator[](&this->instruction_order_,(key_type *)&local_a8);
                  *pmVar15 = mVar8;
                }
                p_Var16 = (this->seen_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent;
                p_Var17 = &p_Var1->_M_header;
                if (p_Var16 == (_Base_ptr)0x0) {
LAB_002444cc:
                  local_a8._M_impl._0_8_ = (Instruction *)0x0;
                  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
                       &local_a8._M_impl.super__Rb_tree_header._M_header;
                  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
                  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
                  TraverseUseDef(this,pIVar19,
                                 (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                                  *)&local_a8,false,false);
                  if (local_a8._M_impl.super__Rb_tree_header._M_node_count != 0) {
                    std::
                    vector<std::set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>,std::allocator<std::set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>>>
                    ::
                    emplace_back<std::set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>>
                              ((vector<std::set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>,std::allocator<std::set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>>>
                                *)&local_c8,
                               (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                                *)&local_a8);
                  }
                  std::
                  _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                  ::_M_erase(&local_a8,
                             (_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)
                  ;
                }
                else {
                  do {
                    if (*(Instruction **)(p_Var16 + 1) >= pIVar19) {
                      p_Var17 = p_Var16;
                    }
                    p_Var16 = (&p_Var16->_M_left)[*(Instruction **)(p_Var16 + 1) < pIVar19];
                  } while (p_Var16 != (_Base_ptr)0x0);
                  if (((_Rb_tree_header *)p_Var17 == p_Var1) ||
                     (pIVar19 < (Instruction *)((_Rb_tree_header *)p_Var17)->_M_node_count))
                  goto LAB_002444cc;
                }
              }
            }
          }
          puVar14 = local_70 + 1;
        } while (puVar14 != local_78);
      }
    }
    bVar9 = 1 < (ulong)(((long)local_c8.
                               super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_c8.
                               super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555
                       );
    if (bVar9) {
      lVar20 = 0x18;
      uVar21 = 0;
      do {
        puVar2 = (undefined8 *)
                 (&((local_c8.
                     super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 + lVar20);
        std::
        _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<spvtools::opt::Instruction*>>
                  ((_Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                    *)this,(_Base_ptr)*puVar2,(_Base_ptr)(puVar2 + -2));
        uVar21 = uVar21 + 1;
        uVar18 = ((long)local_c8.
                        super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_c8.
                        super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
        uVar22 = uVar18 >> 1;
        lVar20 = lVar20 + 0x30;
      } while (uVar21 < uVar22);
      if (local_c8.
          super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_c8.
          super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar20 = (uVar18 >> 1) * 0x30 + 0x18;
        do {
          puVar2 = (undefined8 *)
                   (&((local_c8.
                       super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 + lVar20)
          ;
          std::
          _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
          ::_M_insert_range_unique<std::_Rb_tree_const_iterator<spvtools::opt::Instruction*>>
                    ((_Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                      *)&this->original_loop_instructions_,(_Base_ptr)*puVar2,
                     (_Base_ptr)(puVar2 + -2));
          uVar22 = uVar22 + 1;
          lVar20 = lVar20 + 0x30;
        } while (uVar22 < (ulong)(((long)local_c8.
                                         super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_c8.
                                         super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 -0x5555555555555555));
      }
    }
    std::
    _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::_M_erase(&local_68,(_Link_type)local_68._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  std::
  vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  ::~vector(&local_c8);
  return bVar9;
}

Assistant:

bool LoopFissionImpl::GroupInstructionsByUseDef() {
  std::vector<std::set<Instruction*>> sets{};

  // We want to ignore all the instructions stemming from the loop condition
  // instruction.
  BasicBlock* condition_block = loop_->FindConditionBlock();

  if (!condition_block) return false;
  Instruction* condition = &*condition_block->tail();

  // We iterate over the blocks via iterating over all the blocks in the
  // function, we do this so we are iterating in the same order which the blocks
  // appear in the binary.
  Function& function = *loop_->GetHeaderBlock()->GetParent();

  // Create a temporary set to ignore certain groups of instructions within the
  // loop. We don't want any instructions related to control flow to be removed
  // from either loop only instructions within the control flow bodies.
  std::set<Instruction*> instructions_to_ignore{};
  TraverseUseDef(condition, &instructions_to_ignore, true, true);

  // Traverse control flow instructions to ensure they are added to the
  // seen_instructions_ set and will be ignored when it it called with actual
  // sets.
  for (BasicBlock& block : function) {
    if (!loop_->IsInsideLoop(block.id())) continue;

    for (Instruction& inst : block) {
      // Ignore all instructions related to control flow.
      if (inst.opcode() == spv::Op::OpSelectionMerge || inst.IsBranch()) {
        TraverseUseDef(&inst, &instructions_to_ignore, true, true);
      }
    }
  }

  // Traverse the instructions and generate the sets, automatically ignoring any
  // instructions in instructions_to_ignore.
  for (BasicBlock& block : function) {
    if (!loop_->IsInsideLoop(block.id()) ||
        loop_->GetHeaderBlock()->id() == block.id())
      continue;

    for (Instruction& inst : block) {
      // Record the order that each load/store is seen.
      if (inst.opcode() == spv::Op::OpLoad ||
          inst.opcode() == spv::Op::OpStore) {
        instruction_order_[&inst] = instruction_order_.size();
      }

      // Ignore instructions already seen in a traversal.
      if (seen_instructions_.count(&inst) != 0) {
        continue;
      }

      // Build the set.
      std::set<Instruction*> inst_set{};
      TraverseUseDef(&inst, &inst_set);
      if (!inst_set.empty()) sets.push_back(std::move(inst_set));
    }
  }

  // If we have one or zero sets return false to indicate that due to
  // insufficient instructions we couldn't split the loop into two groups and
  // thus the loop can't be split any further.
  if (sets.size() < 2) {
    return false;
  }

  // Merge the loop sets into two different sets. In CanPerformSplit we will
  // validate that we don't break the relative ordering of loads/stores by doing
  // this.
  for (size_t index = 0; index < sets.size() / 2; ++index) {
    cloned_loop_instructions_.insert(sets[index].begin(), sets[index].end());
  }
  for (size_t index = sets.size() / 2; index < sets.size(); ++index) {
    original_loop_instructions_.insert(sets[index].begin(), sets[index].end());
  }

  return true;
}